

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_acbp_v1.cpp
# Opt level: O0

void __thiscall intel_acbp_v1_t::pmsg_body_t::~pmsg_body_t(pmsg_body_t *this)

{
  pmsg_body_t *this_local;
  
  (this->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__pmsg_body_t_0037b220;
  _clean_up(this);
  std::unique_ptr<intel_acbp_v1_t::signature_t,_std::default_delete<intel_acbp_v1_t::signature_t>_>
  ::~unique_ptr(&this->m_signature);
  std::
  unique_ptr<intel_acbp_v1_t::public_key_t,_std::default_delete<intel_acbp_v1_t::public_key_t>_>::
  ~unique_ptr(&this->m_public_key);
  kaitai::kstruct::~kstruct(&this->super_kstruct);
  return;
}

Assistant:

intel_acbp_v1_t::pmsg_body_t::~pmsg_body_t() {
    _clean_up();
}